

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_loop(pcap_t *p,int cnt,pcap_handler callback,u_char *user)

{
  int local_34;
  int n;
  u_char *user_local;
  pcap_handler callback_local;
  int cnt_local;
  pcap_t *p_local;
  
  callback_local._4_4_ = cnt;
  while( true ) {
    if (p->rfile == (FILE *)0x0) {
      do {
        local_34 = (*p->read_op)(p,callback_local._4_4_,callback,user);
      } while (local_34 == 0);
    }
    else {
      local_34 = pcap_offline_read(p,callback_local._4_4_,callback,user);
    }
    if (local_34 < 1) break;
    if ((0 < callback_local._4_4_) &&
       (callback_local._4_4_ = callback_local._4_4_ - local_34, callback_local._4_4_ < 1)) {
      return 0;
    }
  }
  return local_34;
}

Assistant:

int
pcap_loop(pcap_t *p, int cnt, pcap_handler callback, u_char *user)
{
	register int n;

	for (;;) {
		if (p->rfile != NULL) {
			/*
			 * 0 means EOF, so don't loop if we get 0.
			 */
			n = pcap_offline_read(p, cnt, callback, user);
		} else {
			/*
			 * XXX keep reading until we get something
			 * (or an error occurs)
			 */
			do {
				n = p->read_op(p, cnt, callback, user);
			} while (n == 0);
		}
		if (n <= 0)
			return (n);
		if (!PACKET_COUNT_IS_UNLIMITED(cnt)) {
			cnt -= n;
			if (cnt <= 0)
				return (0);
		}
	}
}